

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O1

void mpp_writer_put_ue(MppWriteCtx *ctx,RK_U32 val)

{
  uint uVar1;
  uint uVar2;
  uint val_00;
  uint uVar3;
  
  val_00 = val + 1;
  uVar2 = 0xffffffff;
  uVar1 = 0xffffffe7;
  do {
    uVar3 = uVar1;
    uVar2 = uVar2 + 2;
    uVar1 = uVar3 + 1;
  } while (val_00 >> ((char)uVar3 + 0x1aU & 0x1f) != 0);
  uVar1 = uVar3 + 0x1a;
  if (0xc < uVar1) {
    uVar2 = uVar3 + 0x19;
    if (0x18 < uVar3 + 0x19) {
      mpp_writer_put_bits(ctx,0,0x18);
      uVar2 = uVar3 + 1;
    }
    mpp_writer_put_bits(ctx,0,uVar2);
    uVar2 = uVar1;
    if (0x18 < uVar1) {
      uVar2 = uVar3 + 2;
      val_00 = val_00 >> ((byte)uVar2 & 0x1f);
      mpp_writer_put_bits(ctx,val_00,0x18);
    }
  }
  mpp_writer_put_bits(ctx,val_00,uVar2);
  return;
}

Assistant:

void mpp_writer_put_ue(MppWriteCtx *ctx, RK_U32 val)
{
    RK_U32 num_bits = 0;

    val++;
    while (val >> ++num_bits);

    if (num_bits > 12) {
        RK_U32 tmp;

        tmp = num_bits - 1;

        if (tmp > 24) {
            tmp -= 24;
            mpp_writer_put_bits(ctx, 0, 24);
        }

        mpp_writer_put_bits(ctx, 0, tmp);

        if (num_bits > 24) {
            num_bits -= 24;
            mpp_writer_put_bits(ctx, val >> num_bits, 24);
            val = val >> num_bits;
        }

        mpp_writer_put_bits(ctx, val, num_bits);
    } else {
        mpp_writer_put_bits(ctx, val, 2 * num_bits - 1);
    }
}